

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O0

void __thiscall
NeuralNetwork::train
          (NeuralNetwork *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *train_xs,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *train_ys,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *test_xs,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *test_ys)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  type this_00;
  ostream *this_01;
  pointer in_RCX;
  pointer in_RDX;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RSI;
  long in_RDI;
  pointer in_R8;
  float fVar4;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  *test_xvs;
  time_point t;
  double trainingLoss;
  int i_4;
  int e;
  int i_3;
  int i_2;
  int i_1;
  int i;
  VectorXf *in_stack_00000128;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  testYvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  testXvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  trainYvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  trainXvecs;
  ssize_t testDataSize;
  ssize_t trainingDataSize;
  value_type *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  ostream *in_stack_fffffffffffffe48;
  NeuralNetwork *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe68;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffe70;
  NeuralNetwork *in_stack_fffffffffffffe78;
  VectorXf *in_stack_fffffffffffffea8;
  NeuralNetwork *this_02;
  duration<double,_std::ratio<1L,_1L>_> local_120;
  undefined8 local_118;
  double local_110;
  int local_108;
  int local_104;
  int local_ec;
  int local_d4;
  int local_bc;
  int local_a8;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_68;
  NeuralNetwork local_50;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_10;
  
  local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_start = in_R8;
  local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_RCX;
  local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(in_RSI);
  sVar2 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (sVar1 != sVar2) {
    __assert_fail("train_xs.size() == train_ys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/neural_network.cpp"
                  ,0x5c,
                  "void NeuralNetwork::train(std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &)"
                 );
  }
  sVar1 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  sVar2 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *)local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if (sVar1 == sVar2) {
    local_50._32_8_ =
         std::
         vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ::size(local_10);
    local_50._24_8_ =
         std::
         vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ::size((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                   super__Vector_impl_data._M_finish);
    this_02 = &local_50;
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)0x145d51);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)0x145d5e);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)0x145d6b);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)0x145d78);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::reserve(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::reserve(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::reserve(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::reserve(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    for (local_a8 = 0; (long)local_a8 < (long)local_50._32_8_; local_a8 = local_a8 + 1) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](local_10,(long)local_a8);
      stdVecToEigenVec(in_stack_fffffffffffffe78,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x145e45);
    }
    for (local_bc = 0; (long)local_bc < (long)local_50._32_8_; local_bc = local_bc + 1) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(long)local_bc);
      stdVecToEigenVec(in_stack_fffffffffffffe78,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x145f0b);
    }
    for (local_d4 = 0; (long)local_d4 < (long)local_50._24_8_; local_d4 = local_d4 + 1) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                      super__Vector_impl_data._M_finish,(long)local_d4);
      stdVecToEigenVec(in_stack_fffffffffffffe78,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x145fb8);
    }
    for (local_ec = 0; (long)local_ec < (long)local_50._24_8_; local_ec = local_ec + 1) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)local_50.layers_.super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                      super__Vector_impl_data._M_start,(long)local_ec);
      stdVecToEigenVec(in_stack_fffffffffffffe78,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70);
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x146065);
    }
    for (local_104 = 0; local_104 < *(int *)(in_RDI + 0x24); local_104 = local_104 + 1) {
      local_108 = 0;
      local_110 = 0.0;
      local_118 = std::chrono::_V2::system_clock::now();
      for (; (long)local_108 < (long)local_50._32_8_; local_108 = local_108 + 1) {
        std::
        vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                      *)&local_50,(long)local_108);
        forwardPropagation(this_02,in_stack_fffffffffffffea8);
        std::
        vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
        ::operator[](&local_68,(long)local_108);
        backPropagation((NeuralNetwork *)
                        testYvecs.
                        super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,in_stack_00000128);
        gradientDescent(this_02);
        gradientClean(in_stack_fffffffffffffe50);
        in_stack_fffffffffffffea8 = (VectorXf *)getLoss((NeuralNetwork *)0x146174);
        local_110 = (double)in_stack_fffffffffffffea8 + local_110;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_57b18);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_104);
      poVar3 = std::operator<<(poVar3,anon_var_dwarf_57b31);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::fixed);
      std::chrono::_V2::system_clock::now();
      this_00 = std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffe48,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffe40);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe50,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffe48);
      test_xvs = (vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_120);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)test_xvs);
      std::operator<<(poVar3,anon_var_dwarf_57b4a);
      std::ostream::flush();
      this_01 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
      fVar4 = getAccuracy((NeuralNetwork *)this_00.__r,test_xvs,
                          (vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                           *)poVar3);
      poVar3 = (ostream *)std::ostream::operator<<(this_01,fVar4 * 100.0);
      in_stack_fffffffffffffe50 = (NeuralNetwork *)std::operator<<(poVar3,"%,loss: ");
      in_stack_fffffffffffffe48 =
           (ostream *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffe50,std::fixed);
      in_stack_fffffffffffffe40 =
           (ostream *)
           std::ostream::operator<<
                     (in_stack_fffffffffffffe48,local_110 / (double)(long)local_50._32_8_);
      std::ostream::operator<<(in_stack_fffffffffffffe40,std::endl<char,std::char_traits<char>>);
    }
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               *)in_stack_fffffffffffffe50);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               *)in_stack_fffffffffffffe50);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               *)in_stack_fffffffffffffe50);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::~vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               *)in_stack_fffffffffffffe50);
    return;
  }
  __assert_fail("test_xs.size() == test_ys.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/neural_network.cpp"
                ,0x5d,
                "void NeuralNetwork::train(std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &)"
               );
}

Assistant:

void NeuralNetwork::train(std::vector<std::vector<float>>& train_xs,
                          std::vector<std::vector<float>>& train_ys,
                          std::vector<std::vector<float>>& test_xs,
                          std::vector<std::vector<float>>& test_ys) {
    using namespace std;
    using namespace chrono;
    using namespace Eigen;
    assert(train_xs.size() == train_ys.size());
    assert(test_xs.size() == test_ys.size());
    ssize_t trainingDataSize = train_xs.size();
    ssize_t testDataSize = test_xs.size();
    vector<VectorXf> trainXvecs, trainYvecs, testXvecs, testYvecs;
    trainXvecs.reserve(trainingDataSize);
    trainYvecs.reserve(trainingDataSize);
    testXvecs.reserve(testDataSize);
    testYvecs.reserve(testDataSize);
    for (int i = 0; i < trainingDataSize; ++i) {
        trainXvecs.push_back(NeuralNetwork::stdVecToEigenVec(train_xs[i]));
        // xvecs.push_back(VectorXf(xs[i].data(),inputSize_));
    }
    for (int i = 0; i < trainingDataSize; ++i) {
        trainYvecs.push_back(NeuralNetwork::stdVecToEigenVec(train_ys[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        testXvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_xs[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        testYvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_ys[i]));
    }
    for (int e = 0; e < epoch_; ++e) {
        int i = 0;
        double trainingLoss = 0;
        auto t = system_clock::now();
        while (i < trainingDataSize) {
            this->forwardPropagation(trainXvecs[i]);
            this->backPropagation(trainYvecs[i]);
            this->gradientDescent();
            this->gradientClean();
            trainingLoss += this->getLoss();
            ++i;
        }
        // cout<<this->layers_[layerCount_-2].weights<<endl;
        // abort();
        cout << "第" << e << "轮已完成,耗时: " << fixed
             << duration<double>(system_clock::now() - t).count() << "秒,准确率：";
        cout.flush();
        cout << fixed << this->getAccuracy(testXvecs, testYvecs) * 100 << R"(%,loss: )" << fixed
             << trainingLoss / trainingDataSize << endl;
    }
}